

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
memory::
Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>::
Array<std::allocator<int>>
          (Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
           *this,vector<int,_std::allocator<int>_> *other)

{
  size_type sVar1;
  int *ptr;
  ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_60;
  HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_> local_31;
  view_type local_30;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *other_local;
  Array<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  *this_local;
  
  local_18 = other;
  other_local = (vector<int,_std::allocator<int>_> *)this;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(other);
  HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>::allocate
            (&local_30,&local_31,sVar1);
  ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
  ::
  ArrayViewImpl<memory::ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,void>
            ((ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
              *)this,&local_30);
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayViewImpl(&local_30);
  ptr = std::vector<int,_std::allocator<int>_>::data(local_18);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(local_18);
  ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::ConstArrayViewImpl(&local_60,ptr,sVar1);
  HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>::
  copy<memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>
            ((HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>> *)
             (this + 0x18),&local_60,
             (ArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
              *)this);
  ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ConstArrayViewImpl(&local_60);
  return;
}

Assistant:

Array(std::vector<value_type, Allocator> const& other)
    : base(coordinator_type().allocate(other.size()))
    {
        coordinator_.copy(
            const_view_type(other.data(), other.size()),
            *this
        );
    }